

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findOrCreateNodeOfSize(MemoryAccountant *this,size_t size)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *pMVar2;
  
  if (this->useCacheSizes_ == true) {
    pMVar1 = findNodeOfSize(this,size);
    return pMVar1;
  }
  pMVar1 = this->head_;
  if (pMVar1 == (MemoryAccountantAllocationNode *)0x0) {
    pMVar1 = (MemoryAccountantAllocationNode *)0x0;
  }
  else if (size < pMVar1->size_) {
    pMVar1 = createNewAccountantAllocationNode(this,size,pMVar1);
    this->head_ = pMVar1;
  }
  while( true ) {
    pMVar2 = pMVar1;
    if (pMVar2 == (MemoryAccountantAllocationNode *)0x0) {
      pMVar1 = createNewAccountantAllocationNode(this,size,this->head_);
      this->head_ = pMVar1;
      return pMVar1;
    }
    if (pMVar2->size_ == size) break;
    pMVar1 = pMVar2->next_;
    if ((pMVar1 == (MemoryAccountantAllocationNode *)0x0) || (size < pMVar1->size_)) {
      pMVar1 = createNewAccountantAllocationNode(this,size,pMVar1);
      pMVar2->next_ = pMVar1;
    }
  }
  return pMVar2;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findOrCreateNodeOfSize(size_t size)
{
    if (useCacheSizes_)
      return findNodeOfSize(size);

    if (head_ && head_->size_ > size)
        head_ = createNewAccountantAllocationNode(size, head_);

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
        if (node->size_ == size)
            return node;
        if (node->next_ == NULLPTR || node->next_->size_ > size)
            node->next_ = createNewAccountantAllocationNode(size, node->next_);
    }
    head_ = createNewAccountantAllocationNode(size, head_);
    return head_;
}